

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_number_t::Generate(ast_number_t *this,ostream *output,int pc)

{
  ostream *poVar1;
  
  std::operator<<(output,"push ");
  poVar1 = std::ostream::_M_insert<double>(this->value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return pc + 1;
}

Assistant:

int ast_number_t::Generate(std::ostream& output, int pc) const {
    output << "push " << this->value << std::endl;
    return pc + 1;
  }